

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
cli::Parser::
CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
print_value(CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  long in_RSI;
  CmdArgument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  stringify((Parser *)this,(string *)(in_RSI + 0xa8));
  return this;
}

Assistant:

virtual std::string print_value() const {
				return stringify(value);
			}